

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * __thiscall DescribeAddressVisitor::operator()(DescribeAddressVisitor *this,PKHash *keyID)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  UniValue *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  UniValue *in_stack_fffffffffffffeb0;
  UniValue *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 uVar1;
  allocator<char> local_11b;
  undefined1 local_11a;
  allocator<char> local_119 [273];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffffe90);
  UniValue::UniValue(in_RDI,(VType)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     in_stack_fffffffffffffe88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)CONCAT17(uVar1,in_stack_fffffffffffffec0),
             (allocator<char> *)in_stack_fffffffffffffeb8);
  local_11a = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffffeb8,(bool *)in_stack_fffffffffffffeb0);
  UniValue::pushKV((UniValue *)CONCAT17(uVar1,in_stack_fffffffffffffec0),
                   (string *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  UniValue::~UniValue(in_stack_fffffffffffffe78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe78);
  std::allocator<char>::~allocator(local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)CONCAT17(uVar1,in_stack_fffffffffffffec0),
             (allocator<char> *)in_stack_fffffffffffffeb8);
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffffeb8,(bool *)in_stack_fffffffffffffeb0);
  UniValue::pushKV((UniValue *)CONCAT17(uVar1,in_stack_fffffffffffffec0),
                   (string *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  UniValue::~UniValue(in_stack_fffffffffffffe78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe78);
  std::allocator<char>::~allocator(&local_11b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue operator()(const PKHash& keyID) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", false);
        obj.pushKV("iswitness", false);
        return obj;
    }